

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O3

CURLcode pop3_perform_authentication(connectdata *conn)

{
  uint uVar1;
  CURLcode CVar2;
  pop3state state2;
  pop3state state1;
  size_t len;
  char *mech;
  pop3state local_30;
  pop3state local_2c;
  char *local_28;
  size_t local_20;
  char *local_18;
  
  local_18 = (char *)0x0;
  local_28 = (char *)0x0;
  local_20 = 0;
  local_2c = POP3_STOP;
  local_30 = POP3_STOP;
  if ((conn->bits).user_passwd == false) {
    (conn->proto).imapc.state = IMAP_STOP;
    return CURLE_OK;
  }
  if ((*(byte *)((long)&conn->proto + 0x88) & 4) != 0) {
    CVar2 = pop3_calc_sasl_details(conn,&local_18,&local_28,&local_20,&local_2c,&local_30);
    if (CVar2 != CURLE_OK) {
      return CVar2;
    }
    if ((local_18 != (char *)0x0) && (((conn->proto).imapc.resptag[4] & 4U) != 0)) {
      CVar2 = pop3_perform_auth(conn,local_18,local_28,local_20,local_2c,local_30);
      if (local_28 == (char *)0x0) {
        return CVar2;
      }
      (*Curl_cfree)(local_28);
      return CVar2;
    }
  }
  uVar1 = (conn->proto).pop3c.authtypes;
  if (((uVar1 & 2) == 0) || (((conn->proto).imapc.resptag[4] & 2U) == 0)) {
    if (((uVar1 & 1) == 0) || (((conn->proto).imapc.resptag[4] & 1U) == 0)) {
      Curl_infof(conn->data,"No known authentication mechanisms supported!\n");
      CVar2 = CURLE_LOGIN_DENIED;
    }
    else {
      CVar2 = pop3_perform_user(conn);
    }
  }
  else {
    CVar2 = pop3_perform_apop(conn);
  }
  return CVar2;
}

Assistant:

static CURLcode pop3_perform_authentication(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct pop3_conn *pop3c = &conn->proto.pop3c;
  const char *mech = NULL;
  char *initresp = NULL;
  size_t len = 0;
  pop3state state1 = POP3_STOP;
  pop3state state2 = POP3_STOP;

  /* Check we have a username and password to authenticate with and end the
     connect phase if we don't */
  if(!conn->bits.user_passwd) {
    state(conn, POP3_STOP);

    return result;
  }

  /* Calculate the SASL login details */
  if(pop3c->authtypes & POP3_TYPE_SASL)
    result = pop3_calc_sasl_details(conn, &mech, &initresp, &len, &state1,
                                    &state2);

  if(!result) {
    if(mech && (pop3c->preftype & POP3_TYPE_SASL)) {
      /* Perform SASL based authentication */
      result = pop3_perform_auth(conn, mech, initresp, len, state1, state2);

      Curl_safefree(initresp);
    }
#ifndef CURL_DISABLE_CRYPTO_AUTH
    else if((pop3c->authtypes & POP3_TYPE_APOP) &&
            (pop3c->preftype & POP3_TYPE_APOP))
      /* Perform APOP authentication */
      result = pop3_perform_apop(conn);
#endif
    else if((pop3c->authtypes & POP3_TYPE_CLEARTEXT) &&
            (pop3c->preftype & POP3_TYPE_CLEARTEXT))
      /* Perform clear text authentication */
      result = pop3_perform_user(conn);
    else {
      /* Other mechanisms not supported */
      infof(conn->data, "No known authentication mechanisms supported!\n");
      result = CURLE_LOGIN_DENIED;
    }
  }

  return result;
}